

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString StringFrom(double value,int precision)

{
  int iVar1;
  size_t extraout_RDX;
  uint in_ESI;
  char *otherBuffer;
  undefined4 in_register_0000003c;
  SimpleString *this;
  SimpleString SVar3;
  size_t sVar2;
  
  this = (SimpleString *)CONCAT44(in_register_0000003c,precision);
  iVar1 = (*PlatformSpecificIsNan)(value);
  if (iVar1 == 0) {
    iVar1 = (*PlatformSpecificIsInf)(value);
    if (iVar1 == 0) {
      SVar3 = StringFromFormat((char *)this,value,"%.*g",(ulong)in_ESI);
      sVar2 = SVar3.bufferSize_;
      goto LAB_002aafd1;
    }
    otherBuffer = "Inf - Infinity";
  }
  else {
    otherBuffer = "Nan - Not a number";
  }
  SimpleString::SimpleString(this,otherBuffer);
  sVar2 = extraout_RDX;
LAB_002aafd1:
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString StringFrom(double value, int precision)
{
    if (PlatformSpecificIsNan(value))
        return "Nan - Not a number";
    else if (PlatformSpecificIsInf(value))
        return "Inf - Infinity";
    else
        return StringFromFormat("%.*g", precision, value);
}